

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

void push_grp_stack(grp_stack *mystack,grp_stack_data data)

{
  grp_stack_item *pgVar1;
  grp_stack_item_struct *pgVar2;
  grp_stack_item_struct *pgVar3;
  grp_stack_item_struct **ppgVar4;
  
  if (mystack != (grp_stack *)0x0) {
    pgVar1 = mystack->top;
    pgVar3 = (grp_stack_item_struct *)malloc(0x18);
    pgVar3->data = data;
    if (pgVar1 == (grp_stack_item *)0x0) {
      pgVar3->next = pgVar3;
      ppgVar4 = &pgVar3->prev;
    }
    else {
      ppgVar4 = &pgVar1->next;
      pgVar2 = pgVar1->next;
      pgVar3->next = pgVar2;
      pgVar3->prev = pgVar1;
      pgVar2->prev = pgVar3;
    }
    *ppgVar4 = pgVar3;
    mystack->top = pgVar3;
    mystack->stack_size = mystack->stack_size + 1;
  }
  return;
}

Assistant:

static void push_grp_stack(grp_stack* mystack, grp_stack_data data) {
  if(!mystack) return;
  mystack->top = grp_stack_append(mystack->top, data);
  ++mystack->stack_size;
  return;
}